

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O0

bool wipe_doBurn(int ticks)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool local_75;
  DWORD bg;
  DWORD fg;
  DWORD *bg2rgb;
  DWORD *fg2rgb;
  int bglevel;
  int fglevel;
  int SHIFT;
  BYTE *fromnew;
  BYTE *fromold;
  BYTE *to;
  int y;
  int x;
  int firey;
  int firex;
  int ystep;
  int xstep;
  bool done;
  int ticks_local;
  
  burntime = ticks + burntime;
  xstep = ticks << 1;
  ystep._3_1_ = false;
  while( true ) {
    iVar1 = xstep;
    if (!ystep._3_1_) {
      xstep = xstep + -1;
    }
    if (ystep._3_1_ || iVar1 == 0) break;
    density = wipe_CalcBurn(burnarray,0x40,0x40,density);
    ystep._3_1_ = density < 0;
  }
  iVar1 = DCanvas::GetWidth((DCanvas *)screen);
  iVar2 = DCanvas::GetHeight((DCanvas *)screen);
  fromold = DCanvas::GetBuffer((DCanvas *)screen);
  fromnew = (BYTE *)wipe_scr_start;
  _fglevel = wipe_scr_end;
  y = 0;
  for (to._0_4_ = 0; iVar3 = DCanvas::GetHeight((DCanvas *)screen), (int)to < iVar3;
      to._0_4_ = (int)to + 1) {
    x = 0;
    for (to._4_4_ = 0; iVar3 = DCanvas::GetWidth((DCanvas *)screen), to._4_4_ < iVar3;
        to._4_4_ = to._4_4_ + 1) {
      uVar4 = burnarray[(x >> 0x10) + (y >> 0x10) * 0x40] / 2;
      if (uVar4 < 0x3f) {
        if (uVar4 == 0) {
          fromold[to._4_4_] = fromnew[to._4_4_];
        }
        else {
          uVar4 = Col2RGB8[(int)uVar4][*(byte *)((long)_fglevel + (long)to._4_4_)] +
                  Col2RGB8[(int)(0x40 - uVar4)][fromnew[to._4_4_]] | 0x1f07c1f;
          fromold[to._4_4_] = RGB32k.All[uVar4 & uVar4 >> 0xf];
        }
        ystep._3_1_ = false;
      }
      else {
        fromold[to._4_4_] = *(BYTE *)((long)_fglevel + (long)to._4_4_);
      }
      x = (int)(0x400000 / (long)iVar1) + x;
    }
    iVar3 = DCanvas::GetWidth((DCanvas *)screen);
    fromnew = fromnew + iVar3;
    iVar3 = DCanvas::GetWidth((DCanvas *)screen);
    _fglevel = (short *)((long)_fglevel + (long)iVar3);
    iVar3 = DCanvas::GetPitch((DCanvas *)screen);
    fromold = fromold + iVar3;
    y = (int)(0x400000 / (long)iVar2) + y;
  }
  local_75 = ystep._3_1_ || 0x28 < burntime;
  return local_75;
}

Assistant:

bool wipe_doBurn (int ticks)
{
	bool done;

	burntime += ticks;
	ticks *= 2;

	// Make the fire burn
	done = false;
	while (!done && ticks--)
	{
		density = wipe_CalcBurn(burnarray, FIREWIDTH, FIREHEIGHT, density);
		done = (density < 0);
	}

	// Draw the screen
	int xstep, ystep, firex, firey;
	int x, y;
	BYTE *to, *fromold, *fromnew;
	const int SHIFT = 16;

	xstep = (FIREWIDTH << SHIFT) / SCREENWIDTH;
	ystep = (FIREHEIGHT << SHIFT) / SCREENHEIGHT;
	to = screen->GetBuffer();
	fromold = (BYTE *)wipe_scr_start;
	fromnew = (BYTE *)wipe_scr_end;

	for (y = 0, firey = 0; y < SCREENHEIGHT; y++, firey += ystep)
	{
		for (x = 0, firex = 0; x < SCREENWIDTH; x++, firex += xstep)
		{
			int fglevel;

			fglevel = burnarray[(firex>>SHIFT)+(firey>>SHIFT)*FIREWIDTH] / 2;
			if (fglevel >= 63)
			{
				to[x] = fromnew[x];
			}
			else if (fglevel == 0)
			{
				to[x] = fromold[x];
				done = false;
			}
			else
			{
				int bglevel = 64-fglevel;
				DWORD *fg2rgb = Col2RGB8[fglevel];
				DWORD *bg2rgb = Col2RGB8[bglevel];
				DWORD fg = fg2rgb[fromnew[x]];
				DWORD bg = bg2rgb[fromold[x]];
				fg = (fg+bg) | 0x1f07c1f;
				to[x] = RGB32k.All[fg & (fg>>15)];
				done = false;
			}
		}
		fromold += SCREENWIDTH;
		fromnew += SCREENWIDTH;
		to += SCREENPITCH;
	}

	return done || (burntime > 40);
}